

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O0

int read_CPR(coda_cdf_product *product_file,int64_t offset)

{
  int iVar1;
  uint local_28;
  uint local_24;
  int32_t ctype;
  int32_t record_type;
  int64_t offset_local;
  coda_cdf_product *product_file_local;
  
  if (offset == 0) {
    product_file_local._4_4_ = 0;
  }
  else {
    _ctype = offset;
    offset_local = (int64_t)product_file;
    iVar1 = read_bytes(product_file->raw_product,offset + 8,4,&local_24);
    if (iVar1 < 0) {
      product_file_local._4_4_ = -1;
    }
    else {
      swap4(&local_24);
      if (local_24 == 0xb) {
        iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),_ctype + 0xc,4,&local_28);
        if (iVar1 < 0) {
          product_file_local._4_4_ = -1;
        }
        else {
          swap4(&local_28);
          if (local_28 == 5) {
            product_file_local._4_4_ = 0;
          }
          else {
            coda_set_error(-200,"Unsupported compression method (%d) for CDF variable",
                           (ulong)local_28);
            product_file_local._4_4_ = -1;
          }
        }
      }
      else {
        coda_set_error(-300,"CDF file has invalid record type (%d) for CPR record",(ulong)local_24);
        product_file_local._4_4_ = -1;
      }
    }
  }
  return product_file_local._4_4_;
}

Assistant:

static int read_CPR(coda_cdf_product *product_file, int64_t offset)
{
    int32_t record_type;
    int32_t ctype;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 11)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for CPR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 4, &ctype) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&ctype);
#endif
    if (ctype != 5)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "Unsupported compression method (%d) for CDF variable", ctype);
        return -1;
    }

    return 0;
}